

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_response.h
# Opt level: O1

string __thiscall LookupResponse::ToString(LookupResponse *this)

{
  undefined8 *puVar1;
  _func_int **local_18;
  
  FileInfo::ToString((FileInfo *)&stack0xffffffffffffffe8);
  puVar1 = (undefined8 *)std::string::insert((ulong)&stack0xffffffffffffffe8,(char *)0x0,0x127679);
  (this->super_NamenodeResponse).super_RpcMessage._vptr_RpcMessage = (_func_int **)*puVar1;
  *puVar1 = std::string::insert;
  std::string::_Rep::_M_dispose((allocator *)(local_18 + -3));
  return (string)(_Alloc_hider)this;
}

Assistant:

virtual string ToString() const {
    return "LookupResponse:: " + file_info_.ToString();
  }